

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naiveproxy.cpp
# Opt level: O0

int __thiscall naiveproxy::open_only_once(naiveproxy *this)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  size_t sVar4;
  size_t sVar5;
  undefined2 local_70;
  undefined2 local_6e;
  flock lock;
  char buf [10];
  int val;
  int fd;
  char filename [20];
  naiveproxy *this_local;
  
  val._0_1_ = '/';
  val._1_1_ = 't';
  val._2_1_ = 'm';
  val._3_1_ = 'p';
  fd._0_1_ = '/';
  fd._1_1_ = 'n';
  fd._2_1_ = 'a';
  fd._3_1_ = 'i';
  builtin_strncpy(filename,"veproxy.pid",0xc);
  this_local._4_4_ = open((char *)&val,0x41,0x1a4);
  if (this_local._4_4_ < 0) {
    this_local._4_4_ = -1;
  }
  else {
    local_70 = 1;
    lock.l_type = 0;
    lock.l_whence = 0;
    lock._4_4_ = 0;
    local_6e = 0;
    lock.l_start = 0;
    iVar1 = fcntl(this_local._4_4_,6,&local_70);
    if (iVar1 < 0) {
      piVar3 = __errno_location();
      if ((*piVar3 != 0xd) && (piVar3 = __errno_location(), *piVar3 != 0xb)) {
        return -1;
      }
      printf("naiveproxy has already run.\n");
      exit(-1);
    }
    iVar1 = ftruncate(this_local._4_4_,0);
    if (iVar1 < 0) {
      this_local._4_4_ = -1;
    }
    else {
      uVar2 = getpid();
      sprintf(&lock.field_0x1e,"%d\n",(ulong)uVar2);
      sVar4 = strlen(&lock.field_0x1e);
      sVar4 = write(this_local._4_4_,&lock.field_0x1e,sVar4);
      sVar5 = strlen(&lock.field_0x1e);
      if (sVar4 == sVar5) {
        uVar2 = fcntl(this_local._4_4_,1,0);
        if ((int)uVar2 < 0) {
          this_local._4_4_ = -1;
        }
        else {
          iVar1 = fcntl(this_local._4_4_,2,(ulong)(uVar2 | 1));
          if (iVar1 < 0) {
            this_local._4_4_ = -1;
          }
          else {
            this->oncefd = this_local._4_4_;
          }
        }
      }
      else {
        this_local._4_4_ = -1;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int naiveproxy::open_only_once()
{
    const char filename[] = "/tmp/naiveproxy.pid";
    int fd, val;
    char buf[10];
    //打开控制文件，控制文件打开方式：O_WRONLY | O_CREAT只写创建方式
    //控制文件权限：S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH用户、用户组读写权限
    if ((fd = open(filename, O_WRONLY | O_CREAT, S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH)) < 0)
    {
        return -1;
    }
    // try and set a write lock on the entire file
    struct flock lock;
    //建立一个供写入用的锁
    lock.l_type = F_WRLCK;
    lock.l_start = 0;
    //以文件开头为锁定的起始位置
    lock.l_whence = SEEK_SET;
    lock.l_len = 0;
    //结合lock中设置的锁类型，控制文件设置文件锁，此处设置写文件锁
    if (fcntl(fd, F_SETLK, &lock) < 0)
    {
        //如果获取写文件锁成功，则退出当前进程，保留后台进程
        if (errno == EACCES || errno == EAGAIN)
        {
            printf("naiveproxy has already run.\n");
            exit(-1); // gracefully exit, daemon is already running
        }
        else
        {
            //   printf("file being used\n");
            return -1; //如果锁被其他进程占用，返回 -1
        }
    }
    // truncate to zero length, now that we have the lock
    //改变文件大小为0
    if (ftruncate(fd, 0) < 0)
        return -1;
    // and write our process ID
    //获取当前进程pid
    sprintf(buf, "%d\n", getpid());
    //将启动成功的进程pid写入控制文件
    if (write(fd, buf, strlen(buf)) != (ssize_t)strlen(buf))
        return -1;

    // set close-on-exec flag for descriptor
    // 获取当前文件描述符close-on-exec标记
    if ((val = fcntl(fd, F_GETFD, 0)) < 0)
        return -1;
    val |= FD_CLOEXEC;
    //关闭进程无用文件描述符
    if (fcntl(fd, F_SETFD, val) < 0)
        return -1;
    // leave file open until we terminate: lock will be held

    oncefd = fd;

    return fd;
}